

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::CheckALLOW_DUPLICATE_CUSTOM_TARGETS(cmGlobalGenerator *this)

{
  cmState *this_00;
  bool bVar1;
  ostream *poVar2;
  ostringstream e;
  string local_1b0;
  string local_190 [11];
  
  this_00 = (this->CMakeInstance->State)._M_t.
            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_190,"ALLOW_DUPLICATE_CUSTOM_TARGETS",(allocator<char> *)&local_1b0);
  bVar1 = cmState::GetGlobalPropertyAsBool(this_00,local_190);
  std::__cxx11::string::~string((string *)local_190);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    poVar2 = std::operator<<((ostream *)local_190,
                             "This project has enabled the ALLOW_DUPLICATE_CUSTOM_TARGETS ");
    poVar2 = std::operator<<(poVar2,"global property.  ");
    poVar2 = std::operator<<(poVar2,"The \"");
    (*this->_vptr_cmGlobalGenerator[3])(&local_1b0,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_1b0);
    poVar2 = std::operator<<(poVar2,"\" generator does not support ");
    poVar2 = std::operator<<(poVar2,"duplicate custom targets.  ");
    poVar2 = std::operator<<(poVar2,
                             "Consider using a Makefiles generator or fix the project to not ");
    std::operator<<(poVar2,"use duplicate target names.");
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  }
  return !bVar1;
}

Assistant:

bool cmGlobalGenerator::CheckALLOW_DUPLICATE_CUSTOM_TARGETS() const
{
  // If the property is not enabled then okay.
  if (!this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(
        "ALLOW_DUPLICATE_CUSTOM_TARGETS")) {
    return true;
  }

  // This generator does not support duplicate custom targets.
  std::ostringstream e;
  e << "This project has enabled the ALLOW_DUPLICATE_CUSTOM_TARGETS "
    << "global property.  "
    << "The \"" << this->GetName() << "\" generator does not support "
    << "duplicate custom targets.  "
    << "Consider using a Makefiles generator or fix the project to not "
    << "use duplicate target names.";
  cmSystemTools::Error(e.str());
  return false;
}